

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,EnumValidityFunc *is_valid)

{
  ExtensionInfo info;
  LogMessage *other;
  undefined7 in_register_00000011;
  LogFinisher local_89;
  FieldType local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined5 uStack_85;
  code *pcStack_80;
  EnumValidityFunc *local_78;
  undefined8 uStack_70;
  LogMessage local_68;
  
  if ((int)CONCAT71(in_register_00000011,type) != 0xe) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x8b);
    other = LogMessage::operator<<
                      (&local_68,"CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(&local_89,other);
    LogMessage::~LogMessage(&local_68);
  }
  pcStack_80 = CallNoArgValidityFunc;
  uStack_70 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_85;
  info.field_3.enum_validity_check.func = CallNoArgValidityFunc;
  info.field_3.enum_validity_check.arg = is_valid;
  info.descriptor = (FieldDescriptor *)0x0;
  local_88 = type;
  uStack_87 = is_repeated;
  uStack_86 = is_packed;
  local_78 = is_valid;
  anon_unknown_0::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* containing_type,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(containing_type, number, info);
}